

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t
exr_attr_list_add(exr_context_t ctxt,exr_attribute_list_t *list,char *name,exr_attribute_type_t type
                 ,int32_t data_len,uint8_t **data_ptr,exr_attribute_t **attr)

{
  uint8_t uVar1;
  exr_attribute_t *peVar2;
  char *pcVar3;
  exr_result_t eVar4;
  size_t sVar5;
  uint uVar6;
  exr_attribute_t *local_38;
  
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    eVar4 = 2;
  }
  else {
    eVar4 = validate_attr_arguments(ctxt,list,name,data_len,data_ptr,attr);
    if (eVar4 == 0) {
      sVar5 = strlen(name);
      if (ctxt->max_name_length < sVar5) {
        eVar4 = (*ctxt->print_error)
                          (ctxt,0xc,"Provided name \'%s\' too long for file (len %d, max %d)",name,
                           sVar5 & 0xffffffff);
        return eVar4;
      }
      if (type - EXR_ATTR_OPAQUE < 0xffffffe3) {
        if (type != EXR_ATTR_OPAQUE) {
          eVar4 = (*ctxt->print_error)
                            (ctxt,3,
                             "Invalid type enum for \'%s\' in create by builtin type (type %d)",name
                             ,(ulong)type);
          return eVar4;
        }
        eVar4 = (*ctxt->print_error)
                          (ctxt,3,
                           "Invalid type enum for \'%s\': the opaque type is not actually a built-in type"
                           ,name);
        return eVar4;
      }
      uVar6 = type - EXR_ATTR_BOX2I;
      eVar4 = create_attr_block(ctxt,&local_38,the_predefined_attr_typenames[uVar6].exp_size,
                                data_len,data_ptr,name,(int32_t)sVar5,(char *)0x0,0);
      peVar2 = local_38;
      if (eVar4 == 0) {
        pcVar3 = the_predefined_attr_typenames[uVar6].name;
        local_38->type_name = pcVar3;
        uVar1 = (uint8_t)the_predefined_attr_typenames[uVar6].name_len;
        local_38->type_name_length = uVar1;
        local_38->type = the_predefined_attr_typenames[uVar6].type;
        eVar4 = add_to_list(ctxt,list,local_38,(char *)CONCAT71((int7)((ulong)pcVar3 >> 8),uVar1));
        if (eVar4 == 0) {
          *attr = peVar2;
          check_attr_handler(ctxt,peVar2);
          return 0;
        }
      }
      if (data_ptr != (uint8_t **)0x0) {
        *data_ptr = (uint8_t *)0x0;
      }
    }
    else if (eVar4 < 0) {
      peVar2 = *attr;
      eVar4 = 0;
      if (peVar2->type != type) {
        *attr = (exr_attribute_t *)0x0;
        eVar4 = (*ctxt->print_error)
                          (ctxt,3,"Entry \'%s\' already in list but with different type (\'%s\')",
                           name,peVar2->type_name,ctxt->print_error);
        return eVar4;
      }
    }
  }
  return eVar4;
}

Assistant:

exr_result_t
exr_attr_list_add (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    exr_attribute_type_t  type,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    const struct _internal_exr_attr_map* known = NULL;

    exr_result_t     rval = EXR_ERR_INVALID_ARGUMENT;
    int32_t          nlen, tidx, mlen;
    size_t           slen;
    exr_attribute_t* nattr = NULL;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    rval = validate_attr_arguments (ctxt, list, name, data_len, data_ptr, attr);
    if (rval != EXR_ERR_SUCCESS)
    {
        if (rval < 0)
        {
            if ((*attr)->type != type)
            {
                nattr = *attr;
                *attr = NULL;
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Entry '%s' already in list but with different type ('%s')",
                    name,
                    nattr->type_name);
            }
            return EXR_ERR_SUCCESS;
        }
        return rval;
    }

    slen = strlen (name);
    mlen = (int32_t) ctxt->max_name_length;
    if (slen > (size_t) mlen)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided name '%s' too long for file (len %d, max %d)",
            name,
            (int) slen,
            mlen);
    }
    nlen = (int32_t) slen;

    tidx = ((int) type) - 1;
    if (tidx < 0 || tidx >= the_predefined_attr_count)
    {
        if (type == EXR_ATTR_OPAQUE)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid type enum for '%s': the opaque type is not actually a built-in type",
                name);

        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid type enum for '%s' in create by builtin type (type %d)",
            name,
            (int) type);
    }

    known = &(the_predefined_attr_typenames[tidx]);

    rval = create_attr_block (
        ctxt, &nattr, known->exp_size, data_len, data_ptr, name, nlen, NULL, 0);

    if (rval == EXR_ERR_SUCCESS)
    {
        nattr->type_name        = known->name;
        nattr->type_name_length = (uint8_t) known->name_len;
        nattr->type             = known->type;
        rval                    = add_to_list (ctxt, list, nattr, name);
    }

    if (rval == EXR_ERR_SUCCESS)
    {
        *attr = nattr;
        check_attr_handler (ctxt, nattr);
    }
    else if (data_ptr)
        *data_ptr = NULL;
    return rval;
}